

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_stroke_circle(nk_command_buffer *b,nk_rect r,float line_thickness,nk_color c)

{
  void *pvVar1;
  float local_48;
  float local_44;
  nk_rect *clip;
  nk_command_circle *cmd;
  float line_thickness_local;
  nk_command_buffer *b_local;
  float fStack_18;
  nk_color c_local;
  nk_rect r_local;
  
  if (b != (nk_command_buffer *)0x0) {
    r_local.x = r.w;
    if ((r_local.x != 0.0) || (NAN(r_local.x))) {
      r_local.y = r.h;
      if (((r_local.y != 0.0) || (NAN(r_local.y))) && (0.0 < line_thickness)) {
        fStack_18 = r.x;
        c_local = (nk_color)r.y;
        if (((b->use_clipping == 0) ||
            (((((b->clip).x <= fStack_18 + r_local.x && (fStack_18 <= (b->clip).x + (b->clip).w)) &&
              ((b->clip).y <= (float)c_local + r_local.y)) &&
             ((float)c_local <= (b->clip).y + (b->clip).h)))) &&
           (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_CIRCLE,0x20), pvVar1 != (void *)0x0)) {
          *(short *)((long)pvVar1 + 0x14) = (short)(int)line_thickness;
          *(short *)((long)pvVar1 + 0x10) = (short)(int)fStack_18;
          *(short *)((long)pvVar1 + 0x12) = (short)(int)(float)c_local;
          if (0.0 <= r_local.x) {
            local_44 = r_local.x;
          }
          else {
            local_44 = 0.0;
          }
          *(short *)((long)pvVar1 + 0x16) = (short)(int)local_44;
          if (0.0 <= r_local.y) {
            local_48 = r_local.y;
          }
          else {
            local_48 = 0.0;
          }
          *(short *)((long)pvVar1 + 0x18) = (short)(int)local_48;
          *(nk_color *)((long)pvVar1 + 0x1a) = c;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_circle(struct nk_command_buffer *b, struct nk_rect r,
    float line_thickness, struct nk_color c)
{
    struct nk_command_circle *cmd;
    if (!b || r.w == 0 || r.h == 0 || line_thickness <= 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(r.x, r.y, r.w, r.h, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_circle*)
        nk_command_buffer_push(b, NK_COMMAND_CIRCLE, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(r.w, 0);
    cmd->h = (unsigned short)NK_MAX(r.h, 0);
    cmd->color = c;
}